

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall
Fifteen::moveNumericTile(Fifteen *this,size_t rowSrc,size_t colSrc,size_t rowDst,size_t colDst)

{
  QPushButton *pQVar1;
  size_t sVar2;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *this_00;
  reference pvVar3;
  QArrayDataPointer<char16_t> local_68;
  size_t local_50;
  size_t local_48;
  _Head_base<0UL,_ImageProvider_*,_false> local_38;
  
  this_00 = TilesBoard::getTiles
                      ((this->tilesBoard)._M_t.
                       super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                       super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                       super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  Controller::getBoardAttributes((Controller *)&stack0xffffffffffffffc0);
  local_50 = colDst;
  pvVar3 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at(this_00,(long)local_38._M_head_impl * rowDst + colDst);
  pQVar1 = (pvVar3->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t
           .super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
           super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
  local_48 = colSrc;
  std::
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  ::at(this_00,(long)local_38._M_head_impl * rowSrc + colSrc);
  QAbstractButton::text();
  QAbstractButton::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  pvVar3 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at(this_00,rowDst * (long)local_38._M_head_impl + local_50);
  pQVar1 = (pvVar3->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t
           .super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
           super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
  Options::getTileColor();
  QWidget::setStyleSheet((QString *)pQVar1);
  sVar2 = local_48;
  pvVar3 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at(this_00,(long)local_38._M_head_impl * rowSrc + local_48);
  pQVar1 = (pvVar3->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t
           .super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
           super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
  QString::QString((QString *)&local_68,"");
  QAbstractButton::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  pvVar3 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at(this_00,rowSrc * (long)local_38._M_head_impl + sVar2);
  pQVar1 = (pvVar3->_M_t).super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t
           .super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
           super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl;
  local_68.d._0_4_ = 3;
  std::
  map<TileColor,_const_QString,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_const_QString>_>_>
  ::at(&Maps::tileColorStyle,(key_type *)&local_68);
  QWidget::setStyleSheet((QString *)pQVar1);
  return;
}

Assistant:

void Fifteen::moveNumericTile( size_t rowSrc, size_t colSrc, size_t rowDst, size_t colDst )
{
    auto& tiles = tilesBoard->getTiles();
    const auto [ boardSize, _ ] = controller->getBoardAttributes();

    tiles.at( rowDst * boardSize + colDst )->setText( tiles.at( rowSrc * boardSize + colSrc )->text() );
    tiles.at( rowDst * boardSize + colDst )->setStyleSheet( Options::getTileColor() );
    tiles.at( rowSrc * boardSize + colSrc )->setText( "" );
    tiles.at( rowSrc * boardSize + colSrc )->setStyleSheet( Maps::tileColorStyle.at( TileColor::EMPTY ));
}